

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O2

void predict_or_learn<true>(bs *d,single_learner *base,example *ec)

{
  int iVar1;
  vw *all;
  vector<double,_std::allocator<double>_> *pvVar2;
  pointer pdVar3;
  _func_void_int_string_v_array<char> *p_Var4;
  v_array<char> vVar5;
  uint32_t uVar6;
  ostream *poVar7;
  vw_exception *this;
  size_t i;
  ulong uVar8;
  undefined4 in_stack_fffffffffffffc78;
  float fVar9;
  undefined1 in_stack_fffffffffffffc80 [24];
  string local_360;
  stringstream __msg;
  ostream local_330;
  stringstream outputStringStream;
  ostream local_1a8;
  
  all = d->all;
  iVar1 = all->raw_prediction;
  fVar9 = ec->weight;
  std::__cxx11::stringstream::stringstream((stringstream *)&outputStringStream);
  pvVar2 = d->pred_vec;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  for (uVar8 = 1; uVar8 <= d->B; uVar8 = uVar8 + 1) {
    uVar6 = BS::weight_gen(all);
    ec->weight = (float)uVar6 * fVar9;
    LEARNER::learner<char,_example>::learn(base,ec,uVar8 - 1);
    ___msg = (double)(ec->pred).scalar;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(d->pred_vec,(double *)&__msg)
    ;
    if (0 < iVar1) {
      if (1 < uVar8) {
        std::operator<<(&local_1a8,' ');
      }
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      poVar7 = std::operator<<(poVar7,':');
      std::ostream::operator<<(poVar7,ec->partial_prediction);
    }
  }
  ec->weight = fVar9;
  if (d->bs_type == 0) {
    bs_predict_mean(all,ec,d->pred_vec);
  }
  else {
    if (d->bs_type != 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar7 = std::operator<<(&local_330,"Unknown bs_type specified: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/bs.cc"
                 ,0xdf,&local_360);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    bs_predict_vote(ec,d->pred_vec);
  }
  if (0 < iVar1) {
    p_Var4 = all->print_text;
    iVar1 = all->raw_prediction;
    std::__cxx11::stringbuf::str();
    vVar5._begin._4_4_ = fVar9;
    vVar5._begin._0_4_ = in_stack_fffffffffffffc78;
    vVar5._end = (char *)in_stack_fffffffffffffc80._0_8_;
    vVar5.end_array = (char *)in_stack_fffffffffffffc80._8_8_;
    vVar5.erase_count = in_stack_fffffffffffffc80._16_8_;
    (*p_Var4)(iVar1,(string)ec->tag,vVar5);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc80);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
  return;
}

Assistant:

void predict_or_learn(bs& d, single_learner& base, example& ec)
{
  vw& all = *d.all;
  bool shouldOutput = all.raw_prediction > 0;

  float weight_temp = ec.weight;

  stringstream outputStringStream;
  d.pred_vec->clear();

  for (size_t i = 1; i <= d.B; i++)
  {
    ec.weight = weight_temp * (float)BS::weight_gen(all);

    if (is_learn)
      base.learn(ec, i - 1);
    else
      base.predict(ec, i - 1);

    d.pred_vec->push_back(ec.pred.scalar);

    if (shouldOutput)
    {
      if (i > 1)
        outputStringStream << ' ';
      outputStringStream << i << ':' << ec.partial_prediction;
    }
  }

  ec.weight = weight_temp;

  switch (d.bs_type)
  {
    case BS_TYPE_MEAN:
      bs_predict_mean(all, ec, *d.pred_vec);
      break;
    case BS_TYPE_VOTE:
      bs_predict_vote(ec, *d.pred_vec);
      break;
    default:
      THROW("Unknown bs_type specified: " << d.bs_type);
  }

  if (shouldOutput)
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
}